

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::StartTesting(BasicReporter *this)

{
  SpanInfo *in_RDI;
  SpanInfo *in_stack_ffffffffffffffa8;
  
  SpanInfo::SpanInfo(in_RDI);
  SpanInfo::operator=(in_RDI,in_stack_ffffffffffffffa8);
  SpanInfo::~SpanInfo((SpanInfo *)0x1a7131);
  return;
}

Assistant:

virtual void StartTesting() {
            m_testingSpan = SpanInfo();
        }